

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O3

void __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
          (TemporaryBuffer *this,uint ch)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  uint uVar5;
  
  uVar5 = this->m_cchMax;
  uVar3 = this->m_ichCur;
  if (uVar5 <= uVar3) {
    Grow(this);
    uVar5 = this->m_cchMax;
    uVar3 = this->m_ichCur;
  }
  if (uVar5 <= uVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.h"
                       ,0x2a1,"(m_ichCur < m_cchMax)","m_ichCur < m_cchMax");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    uVar3 = this->m_ichCur;
  }
  this->m_ichCur = uVar3 + 1;
  this->m_prgch[uVar3] = (OLECHAR)ch;
  return;
}

Assistant:

void AppendCh(uint ch)
        {
            if (performAppend)
            {
                if (m_ichCur >= m_cchMax)
                {
                    Grow();
                }

                Assert(m_ichCur < m_cchMax);
                __analysis_assume(m_ichCur < m_cchMax);

                m_prgch[m_ichCur++] = static_cast<OLECHAR>(ch);
            }
        }